

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> *
cfd::core::RandomNumberUtil::GetRandomIndexes
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          uint32_t length)

{
  key_type kVar1;
  bool bVar2;
  int iVar3;
  result_type rVar4;
  reference pvVar5;
  size_type sVar6;
  pair<std::_Rb_tree_const_iterator<unsigned_int>,_bool> pVar7;
  key_type in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  size_type in_stack_ffffffffffffff48;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff50;
  uint local_68;
  key_type local_64;
  uint32_t index;
  uint32_t value;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> exist_value;
  uniform_int_distribution<int> dist;
  uint32_t length_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *result;
  
  if ((GetRandomIndexes(unsigned_int)::rd == '\0') &&
     (iVar3 = __cxa_guard_acquire(&GetRandomIndexes(unsigned_int)::rd), iVar3 != 0)) {
    std::random_device::random_device(&GetRandomIndexes::rd);
    __cxa_atexit(std::random_device::~random_device,&GetRandomIndexes::rd,&__dso_handle);
    __cxa_guard_release(&GetRandomIndexes(unsigned_int)::rd);
  }
  if ((GetRandomIndexes(unsigned_int)::engine == '\0') &&
     (iVar3 = __cxa_guard_acquire(&GetRandomIndexes(unsigned_int)::engine), iVar3 != 0)) {
    rVar4 = std::random_device::operator()(&GetRandomIndexes::rd);
    std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::mersenne_twister_engine(&GetRandomIndexes::engine,(ulong)rVar4);
    __cxa_guard_release(&GetRandomIndexes(unsigned_int)::engine);
  }
  std::uniform_int_distribution<int>::uniform_int_distribution
            ((uniform_int_distribution<int> *)
             ((long)&exist_value._M_t._M_impl.super__Rb_tree_header._M_node_count + 4),0,length);
  exist_value._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ = 0;
  ::std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x3f2a69);
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
             (allocator_type *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  ::std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x3f2a8b);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)&index);
  if (length == 1) {
    pvVar5 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        __return_storage_ptr__,0);
    *pvVar5 = 0;
  }
  else if (1 < length) {
    local_68 = 0;
    while (local_68 < length - 1) {
      local_64 = ::std::uniform_int_distribution<int>::operator()
                           ((uniform_int_distribution<int> *)
                            ((long)&exist_value._M_t._M_impl.super__Rb_tree_header._M_node_count + 4
                            ),&GetRandomIndexes::engine);
      if (length <= local_64) {
        local_64 = local_64 / length;
      }
      bVar2 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::empty
                        ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)&index);
      if ((bVar2) ||
         (sVar6 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                  count((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *
                        )&index,&local_64), sVar6 == 0)) {
        in_stack_ffffffffffffff40 = local_64;
        pvVar5 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            __return_storage_ptr__,(ulong)local_68);
        *pvVar5 = in_stack_ffffffffffffff40;
        pVar7 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                insert((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                       &index,&local_64);
        in_stack_ffffffffffffff44 = CONCAT13(pVar7.second,(int3)in_stack_ffffffffffffff44);
        local_68 = local_68 + 1;
      }
    }
    for (local_64 = 0; local_64 < length; local_64 = local_64 + 1) {
      sVar6 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::count
                        ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)&index,&local_64);
      kVar1 = local_64;
      if (sVar6 == 0) {
        pvVar5 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            __return_storage_ptr__,(ulong)(length - 1));
        *pvVar5 = kVar1;
        break;
      }
    }
  }
  exist_value._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ = 1;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)&index);
  if ((exist_value._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ & 1) == 0) {
    ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32_t> RandomNumberUtil::GetRandomIndexes(uint32_t length) {
#if defined(_WIN32) && defined(__GNUC__) && (__GNUC__ < 9)
  // for mingw gcc lower 9
  static std::mt19937 engine(static_cast<unsigned int>(time(nullptr)));
#else
  static std::random_device rd;
  static std::mt19937 engine(rd());
#endif
  std::uniform_int_distribution<> dist(0, length);
  std::vector<uint32_t> result(length);
  std::set<uint32_t> exist_value;
  uint32_t value;

  if (length == 1) {
    result[0] = 0;
  } else if (length > 1) {
    uint32_t index = 0;
    while (index < (length - 1)) {
      value = dist(engine);
      if (value >= length) {
        value /= length;
      }
      if ((exist_value.empty()) || (exist_value.count(value) == 0)) {  // MSVC
        result[index] = value;
        exist_value.insert(value);
        ++index;
      }
    }

    for (value = 0; value < length; ++value) {
      if (exist_value.count(value) == 0) {
        result[length - 1] = value;
        break;
      }
    }
  }

  return result;
}